

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

IDiagObjectAddress * __thiscall
Js::ObjectVariablesWalker::GetObjectAddress(ObjectVariablesWalker *this,int index)

{
  Type pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *ppDVar6;
  undefined4 extraout_var;
  RecyclableObjectAddress *this_00;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  
  this_01 = (this->super_VariableWalkerBase).pMembersList;
  if ((this_01->
      super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
      ).count <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x370,"(index < pMembersList->Count())",
                                "index < pMembersList->Count()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    this_01 = (this->super_VariableWalkerBase).pMembersList;
  }
  ppDVar6 = JsUtil::
            List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(this_01,index);
  pDVar1 = *ppDVar6;
  iVar4 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[0xe])();
  this_00 = (RecyclableObjectAddress *)
            new<Memory::ArenaAllocator>
                      (0x28,(ArenaAllocator *)CONCAT44(extraout_var,iVar4),0x364470);
  RecyclableObjectAddress::RecyclableObjectAddress
            (this_00,(this->super_VariableWalkerBase).instance,pDVar1->propId,pDVar1->aVar,
             pDVar1->flags >> 1 & 1);
  return &this_00->super_IDiagObjectAddress;
}

Assistant:

IDiagObjectAddress * ObjectVariablesWalker::GetObjectAddress(int index)
    {
        Assert(index < pMembersList->Count());

        DebuggerPropertyDisplayInfo* info = pMembersList->Item(index);
        return Anew(pFrame->GetArena(), RecyclableObjectAddress, instance, info->propId, info->aVar, info->IsInDeadZone() ? TRUE : FALSE);
    }